

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::matchEnumScalar(Input *this,char *Str,bool param_2)

{
  bool bVar1;
  StringRef local_50;
  StringRef local_40;
  ret_type local_30;
  ScalarHNode *SN;
  char *pcStack_20;
  bool param_2_local;
  char *Str_local;
  Input *this_local;
  
  if (((this->ScalarMatchFound & 1U) == 0) &&
     (SN._7_1_ = param_2, pcStack_20 = Str, Str_local = (char *)this,
     local_30 = dyn_cast<llvm::yaml::Input::ScalarHNode,llvm::yaml::Input::HNode>(this->CurrentNode)
     , local_30 != (ret_type)0x0)) {
    local_40 = ScalarHNode::value(local_30);
    StringRef::StringRef(&local_50,pcStack_20);
    bVar1 = StringRef::equals(&local_40,local_50);
    if (bVar1) {
      this->ScalarMatchFound = true;
      return true;
    }
  }
  return false;
}

Assistant:

bool Input::matchEnumScalar(const char *Str, bool) {
  if (ScalarMatchFound)
    return false;
  if (ScalarHNode *SN = dyn_cast<ScalarHNode>(CurrentNode)) {
    if (SN->value().equals(Str)) {
      ScalarMatchFound = true;
      return true;
    }
  }
  return false;
}